

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,half *v)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  tinyusdz *local_18;
  half *v_local;
  
  local_18 = this;
  v_local = (half *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::operator<<(aoStack_190,(half *)local_18);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::value::half &v) {
  std::stringstream ss;
  ss << v;
  return ss.str();
}